

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.c
# Opt level: O0

int mixed_buffer_copy(mixed_buffer *from,mixed_buffer *to)

{
  uint32_t local_2c;
  float *pfStack_28;
  uint32_t samples;
  float *write;
  float *read;
  mixed_buffer *to_local;
  mixed_buffer *from_local;
  
  read = (float *)to;
  to_local = from;
  mixed_err(0);
  if (to_local != (mixed_buffer *)read) {
    local_2c = 0xffffffff;
    mixed_buffer_request_read(&write,&local_2c,to_local);
    mixed_buffer_request_write(&stack0xffffffffffffffd8,&local_2c,(mixed_buffer *)read);
    memcpy(pfStack_28,write,(ulong)local_2c << 2);
    mixed_buffer_finish_write(local_2c,(mixed_buffer *)read);
  }
  return 1;
}

Assistant:

MIXED_EXPORT int mixed_buffer_copy(struct mixed_buffer *from, struct mixed_buffer *to){
  mixed_err(MIXED_NO_ERROR);
  if(from != to){
    float *restrict read, *restrict write;
    uint32_t samples = UINT32_MAX;
    mixed_buffer_request_read(&read, &samples, from);
    mixed_buffer_request_write(&write, &samples, to);
    memcpy(write, read, sizeof(float)*samples);
    mixed_buffer_finish_write(samples, to);
  }
  return 1;
}